

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConstructors2<glcts::ArraysOfArrays::Interface::GL>
::test_shader_compilation
          (ConstructorsAndUnsizedDeclConstructors2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  ulong uVar1;
  TestError *this_00;
  string shader_source;
  string base_variable_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  uVar1 = (ulong)tested_shader_type;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&base_variable_string,
             "    float[2][2] x = float[2][2](float[4](1.0, 2.0, 3.0, 4.0));\n",
             (allocator<char> *)&shader_source);
  std::operator+(&shader_source,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 shader_start_abi_cxx11_,&base_variable_string);
  switch(uVar1) {
  case 0:
  case 2:
  case 5:
    goto switchD_00b8a89d_caseD_0;
  case 1:
    std::__cxx11::string::append((char *)&shader_source);
    goto switchD_00b8a89d_caseD_0;
  case 3:
    break;
  case 4:
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x814);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::append((string *)&shader_source);
switchD_00b8a89d_caseD_0:
  std::__cxx11::string::append((string *)&shader_source);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[8])(this,uVar1,&shader_source);
  std::__cxx11::string::assign((char *)&base_variable_string);
  std::operator+(&local_40,&base_variable_string,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 shader_start_abi_cxx11_);
  std::__cxx11::string::operator=((string *)&shader_source,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (*(code *)(&DAT_0171c1ac + *(int *)(&DAT_0171c1ac + uVar1 * 4)))();
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclConstructors2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string base_variable_string = "    float[2][2] x = float[2][2](float[4](1.0, 2.0, 3.0, 4.0));\n";
	std::string shader_source		 = shader_start + base_variable_string;

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	this->execute_negative_test(tested_shader_type, shader_source);

	base_variable_string = "float[2][2] x = float[2][2](float[1][4](float[4](1.0, 2.0, 3.0, 4.0)));\n\n";
	shader_source		 = base_variable_string + shader_start;

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	this->execute_negative_test(tested_shader_type, shader_source);
}